

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpAddress.cpp
# Opt level: O2

void getLocalIP(char *addressBuffer)

{
  ifaddrs *ifAddrStruct;
  
  ifAddrStruct = (ifaddrs *)0x0;
  getifaddrs(&ifAddrStruct);
  for (; ifAddrStruct != (ifaddrs *)0x0; ifAddrStruct = ifAddrStruct->ifa_next) {
    if (ifAddrStruct->ifa_addr->sa_family == 2) {
      inet_ntop(2,ifAddrStruct->ifa_addr->sa_data + 2,addressBuffer,0x10);
    }
  }
  return;
}

Assistant:

void getLocalIP(char* addressBuffer) {
    struct ifaddrs * ifAddrStruct=NULL;
    void * tmpAddrPtr=NULL;
    getifaddrs(&ifAddrStruct);
    while (ifAddrStruct!=NULL) {
        if (ifAddrStruct->ifa_addr->sa_family==AF_INET) { // check it is IP4
            tmpAddrPtr=&((struct sockaddr_in *)ifAddrStruct->ifa_addr)->sin_addr;
            inet_ntop(AF_INET, tmpAddrPtr, addressBuffer, INET_ADDRSTRLEN);
        }
        ifAddrStruct=ifAddrStruct->ifa_next;
    }
//    cout << addressBuffer << endl;
}